

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTSayIntentions.cpp
# Opt level: O2

bool __thiscall SayIntentionsConnection::ProcessFetchedData(SayIntentionsConnection *this)

{
  _Alloc_hider _Var1;
  bool bVar2;
  uint uVar3;
  JSON_Array *array;
  size_t sVar4;
  JSON_Object *object;
  char *pcVar5;
  unsigned_long _num;
  long lVar6;
  long lVar7;
  SayIntentionsConnection *this_00;
  ulong index;
  allocator<char> local_39a;
  allocator<char> local_399;
  LTFlightData *local_398;
  pthread_mutex_t *local_390;
  double local_388;
  SayIntentionsConnection *local_380;
  JSONRootPtr pRoot;
  unique_lock<std::mutex> mapFdLock;
  positionTy local_350;
  string acFilter;
  FDKeyTy fdKey;
  FDStaticData stat;
  FDDynamicData dyn;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  positionTy viewPos;
  
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos == 0) {
    return true;
  }
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.httpResponse != 200) {
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    return false;
  }
  pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
  super__Head_base<0UL,_json_value_t_*,_false>._M_head_impl = json_parse_string((char *)0x181e77);
  pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
  super__Tuple_impl<1UL,_void_(*)(json_value_t_*)>.
  super__Head_base<1UL,_void_(*)(json_value_t_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(json_value_t_*),_false>)json_value_free;
  if (pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>._M_t.
      super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
      super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
      super__Head_base<0UL,_json_value_t_*,_false>._M_head_impl == (JSON_Value *)0x0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSayIntentions.cpp"
             ,0x70,"ProcessFetchedData",logERR,"Parsing flight data as JSON failed");
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
  }
  else {
    array = json_array(pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>._M_t.
                       super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
                       super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
                       super__Head_base<0UL,_json_value_t_*,_false>._M_head_impl);
    if (array != (JSON_Array *)0x0) {
      DataRefs::GetViewPos();
      local_380 = this;
      DataRefs::GetDebugAcFilter_abi_cxx11_(&acFilter,&dataRefs);
      for (index = 0; sVar4 = json_array_get_count(array), index < sVar4; index = index + 1) {
        object = json_array_get_object(array,index);
        if (object != (JSON_Object *)0x0) {
          pcVar5 = jog_s(object,"displayname");
          bVar2 = std::operator==(pcVar5,&dataRefs.sSIDisplayName);
          if (!bVar2) {
            _num = jog_l(object,"flight_id");
            LTFlightData::FDKeyTy::FDKeyTy(&fdKey,KEY_SAYINTENTIONS,_num);
            if (acFilter._M_string_length == 0) {
LAB_00181f9a:
              local_388 = jog_n_nan(object,"lat");
              local_398 = (LTFlightData *)jog_n_nan(object,"lon");
              lVar6 = jog_l(object,"altitude");
              local_390 = (pthread_mutex_t *)local_380->tsRequest;
              lVar7 = jog_l(object,"heading");
              local_350._alt = (double)lVar6 * 0.3048;
              local_350._head = (double)lVar7;
              local_350._lat = local_388;
              local_350._lon = (double)local_398;
              local_350._ts = (double)local_390;
              local_350._pitch = NAN;
              local_350._roll = NAN;
              local_350.mergeCount = 1;
              local_350._60_4_ = local_350._60_4_ & 0xffff8000;
              local_350.edgeIdx = 0xffffffffffffffff;
              local_388 = CoordDistance(&local_350,&viewPos);
              if (local_388 <= (double)(dataRefs.fdStdDistance * 0x73c)) {
                lVar6 = jog_l(object,"altitude_agl");
                if (lVar6 < 1) {
                  local_350._60_4_ = local_350._60_4_ & 0xfffffcff | 0x200;
                }
                std::unique_lock<std::mutex>::unique_lock(&mapFdLock,&mapFdMutex);
                local_398 = std::
                            map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                            ::operator[](&mapFd,&fdKey);
                local_390 = (pthread_mutex_t *)&local_398->dataAccessMutex;
                std::recursive_mutex::lock((recursive_mutex *)&local_390->__data);
                std::unique_lock<std::mutex>::unlock(&mapFdLock);
                if ((local_398->acKey).key._M_string_length == 0) {
                  LTFlightData::SetKey(local_398,&fdKey);
                }
                stat.reg._M_dataplus._M_p = (pointer)&stat.reg.field_2;
                stat.reg._M_string_length = 0;
                stat.reg.field_2._M_local_buf[0] = '\0';
                stat.country._M_dataplus._M_p = (pointer)&stat.country.field_2;
                stat.country._M_string_length = 0;
                stat.country.field_2._M_local_buf[0] = '\0';
                stat.acTypeIcao._M_dataplus._M_p = (pointer)&stat.acTypeIcao.field_2;
                stat.acTypeIcao._M_string_length = 0;
                stat.acTypeIcao.field_2._M_local_buf[0] = '\0';
                stat.man._M_dataplus._M_p = (pointer)&stat.man.field_2;
                stat.man._M_string_length = 0;
                stat.man.field_2._M_local_buf[0] = '\0';
                stat.mdl._M_dataplus._M_p = (pointer)&stat.mdl.field_2;
                stat.mdl._M_string_length = 0;
                stat.mdl.field_2._M_local_buf[0] = '\0';
                stat.catDescr._M_dataplus._M_p = (pointer)&stat.catDescr.field_2;
                stat.catDescr._M_string_length = 0;
                stat.catDescr.field_2._M_local_buf[0] = '\0';
                stat.engType = -1;
                stat.engMount = -1;
                stat.year = 0;
                stat.mil = false;
                stat.pDoc8643 = (Doc8643 *)0x0;
                stat.call._M_dataplus._M_p = (pointer)&stat.call.field_2;
                stat.call._M_string_length = 0;
                stat.call.field_2._M_local_buf[0] = '\0';
                stat.stops.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                stat.stops.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                stat.stops.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                stat.flight._M_dataplus._M_p = (pointer)&stat.flight.field_2;
                stat.flight._M_string_length = 0;
                stat.flight.field_2._M_local_buf[0] = '\0';
                stat.slug._M_dataplus._M_p = (pointer)&stat.slug.field_2;
                stat.slug._M_string_length = 0;
                stat.slug.field_2._M_local_buf[0] = '\0';
                stat.op._M_dataplus._M_p = (pointer)&stat.op.field_2;
                stat.op._M_string_length = 0;
                stat.op.field_2._M_local_buf[0] = '\0';
                stat.opIcao._M_dataplus._M_p = (pointer)&stat.opIcao.field_2;
                stat.opIcao._M_string_length = 0;
                stat.opIcao.field_2._M_local_buf[0] = '\0';
                stat.bDataMaster = false;
                stat.bDataRoute = false;
                jog_s(object,"tail_number");
                std::__cxx11::string::assign((char *)&stat);
                jog_s(object,"aircraft_icao");
                std::__cxx11::string::assign((char *)&stat.acTypeIcao);
                this_00 = (SayIntentionsConnection *)jog_s(object,"callsign");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_b8,(char *)this_00,(allocator<char> *)&local_d8);
                UnprocessCallSign((string *)&dyn,this_00,&local_b8);
                std::__cxx11::string::operator=((string *)&stat.call,(string *)&dyn);
                std::__cxx11::string::~string((string *)&dyn);
                std::__cxx11::string::~string((string *)&local_b8);
                pcVar5 = jog_s(object,"origin");
                std::__cxx11::string::string<std::allocator<char>>((string *)&dyn,pcVar5,&local_399)
                ;
                pcVar5 = jog_s(object,"final_destination");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_d8,pcVar5,&local_39a);
                LTFlightData::FDStaticData::setOrigDest(&stat,(string *)&dyn,&local_d8);
                std::__cxx11::string::~string((string *)&local_d8);
                std::__cxx11::string::~string((string *)&dyn);
                jog_s(object,"displayname");
                std::__cxx11::string::assign((char *)&stat.flight);
                LTFlightData::FDDynamicData::FDDynamicData(&dyn);
                dyn.gnd = ((ushort)local_350.f & 0x300) == 0x200;
                dyn.heading = local_350._head;
                dyn.spd = jog_n_nan(object,"airspeed");
                dyn.ts = local_350._ts;
                dyn.pChannel = (LTChannel *)local_380;
                LTFlightData::UpdateData(local_398,&stat,local_388,DATREQU_NONE);
                bVar2 = positionTy::isNormal(&local_350,true);
                _Var1 = fdKey.key._M_dataplus;
                if (bVar2) {
                  LTFlightData::AddDynData(local_398,&dyn,0,0,&local_350);
                }
                else if ((int)dataRefs.iLogLevel < 1) {
                  positionTy::dbgTxt_abi_cxx11_(&local_d8,&local_350);
                  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSayIntentions.cpp"
                         ,0xcc,"ProcessFetchedData",logDEBUG,"A/c %s reached invalid pos: %s",
                         _Var1._M_p,local_d8._M_dataplus._M_p);
                  std::__cxx11::string::~string((string *)&local_d8);
                }
                LTFlightData::FDStaticData::~FDStaticData(&stat);
                pthread_mutex_unlock(local_390);
                std::unique_lock<std::mutex>::~unique_lock(&mapFdLock);
              }
            }
            else {
              std::__cxx11::string::string((string *)&local_98,(string *)&acFilter);
              bVar2 = std::operator!=(&fdKey.key,&local_98);
              std::__cxx11::string::~string((string *)&local_98);
              if (!bVar2) goto LAB_00181f9a;
            }
            std::__cxx11::string::~string((string *)&fdKey.key);
          }
        }
      }
      std::__cxx11::string::~string((string *)&acFilter);
      bVar2 = true;
      goto LAB_001825f7;
    }
    if ((int)dataRefs.iLogLevel < 4) {
      uVar3 = json_type(pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>._M_t.
                        super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
                        super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
                        super__Head_base<0UL,_json_value_t_*,_false>._M_head_impl);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSayIntentions.cpp"
             ,0x76,"ProcessFetchedData",logERR,"Expected a JSON Array, but got type %d",(ulong)uVar3
            );
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
  }
  bVar2 = false;
LAB_001825f7:
  std::unique_ptr<json_value_t,_void_(*)(json_value_t_*)>::~unique_ptr
            (&pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>);
  return bVar2;
}

Assistant:

bool SayIntentionsConnection::ProcessFetchedData ()
{
    // data is expected to be in netData string
    // short-cut if there is nothing
    if ( !netDataPos ) return true;
    
    // Only proceed in case HTTP response was OK
    if (httpResponse != HTTP_OK) {
        IncErrCnt();
        return false;
    }
    
    // now try to interpret it as JSON
    JSONRootPtr pRoot (netData);
    if (!pRoot) { LOG_MSG(logERR,ERR_JSON_PARSE); IncErrCnt(); return false; }
    
    // The entire JSON is an array of objects
    const JSON_Array* pArrAc = json_array(pRoot.get());
    if (!pArrAc) {
        LOG_MSG(logERR, "Expected a JSON Array, but got type %d",
                (int)json_type(pRoot.get()));
        IncErrCnt();
        return false;
    }
    
    // We need to calculate distance to current camera later on
    const positionTy viewPos = dataRefs.GetViewPos();
    // any a/c filter defined for debugging purposes?
    const std::string acFilter ( dataRefs.GetDebugAcFilter() );

    // Process all flights
    for (size_t i = 0; i < json_array_get_count(pArrAc); ++i)
    {
        const JSON_Object* pAc = json_array_get_object(pArrAc, i);
        if (!pAc) continue;
        
        // Displayname is matching? My own flight! -> Skip it
        if (jog_s(pAc, SI_DISPLAYNAME) == dataRefs.GetSIDisplayName())
            continue;

        // Key is the SayIntentions flight_id
        LTFlightData::FDKeyTy fdKey (LTFlightData::KEY_SAYINTENTIONS,
                                     (unsigned long)jog_l(pAc, SI_KEY));
        // not matching a/c filter? -> skip it
        if (!acFilter.empty() && (fdKey != acFilter))
            continue;
        
        // Position
        positionTy pos (jog_n_nan(pAc, SI_LAT),
                        jog_n_nan(pAc, SI_LON),
                        jog_l(pAc, SI_ALT) * M_per_FT,
                        tsRequest,
                        jog_l(pAc, SI_HEADING));
        
        // SI returns all world's traffic, we restrict to what's within defined limits
        const double dist = pos.dist(viewPos);
        if (dist > dataRefs.GetFdStdDistance_m() )
            continue;
        
        // On ground?
        if (jog_l(pAc, SI_ALT_AGL) <= 0)
            pos.f.onGrnd = GND_ON;

        // from here on access to fdMap guarded by a mutex
        // until FD object is inserted and updated
        std::unique_lock<std::mutex> mapFdLock (mapFdMutex);

        // get the fd object from the map, key is the flight_id,
        // this fetches an existing or, if not existing, creates a new one
        LTFlightData& fd = mapFd[fdKey];

        // also get the data access lock once and for all
        // so following fetch/update calls only make quick recursive calls
        std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
        // now that we have the detail lock we can release the global one
        mapFdLock.unlock();

        // completely new? fill key fields
        if ( fd.empty() )
            fd.SetKey(fdKey);
        
        // -- fill static data --
        LTFlightData::FDStaticData stat;
        stat.reg            = jog_s(pAc, SI_REG);
        stat.acTypeIcao     = jog_s(pAc, SI_AC_TYPE);
        stat.call           = UnprocessCallSign(jog_s(pAc, SI_CALL));
        stat.setOrigDest(jog_s(pAc, SI_ORIGIN),
                         jog_s(pAc, SI_DEST));
        stat.flight         = jog_s(pAc, SI_DISPLAYNAME);
        
        // -- dynamic data --
        LTFlightData::FDDynamicData dyn;
        dyn.gnd             = pos.IsOnGnd();
        dyn.heading         = pos.heading();
        dyn.spd             = jog_n_nan(pAc, SI_SPD);
        dyn.ts              = pos.ts();
        dyn.pChannel        = this;
        
        // update the a/c's master data
        fd.UpdateData(std::move(stat), dist);
        
        // position is rather important, we check for validity
        if ( pos.isNormal(true) ) {
            fd.AddDynData(dyn, 0, 0, &pos);
        }
        else
            LOG_MSG(logDEBUG,ERR_POS_UNNORMAL,fdKey.c_str(),pos.dbgTxt().c_str());
    }
    
    // all good
    return true;
}